

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

IndexTensor *
dynet::TensorTools::argmax_dev<dynet::Device_CPU>(Device_CPU *dev,Tensor *v,uint dim,uint num)

{
  runtime_error *this;
  invalid_argument *this_00;
  reference ppAVar1;
  DenseIndex *pDVar2;
  uint in_ECX;
  void *in_RDX;
  IndexTensor *in_RDI;
  uint in_R8D;
  AlignedMemoryPool *pool;
  Dim ids_dim;
  ostringstream oss_1;
  ostringstream oss;
  value_type dev_00;
  Dim *in_stack_fffffffffffffb90;
  Device *in_stack_fffffffffffffb98;
  ostringstream *poVar3;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffba0;
  Dim *in_stack_fffffffffffffba8;
  IndexTensor *return_dim;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_0>
  *in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  AlignedMemoryPool *in_stack_fffffffffffffbd0;
  Tensor *local_418;
  uint local_388 [9];
  undefined1 local_361;
  string local_360 [32];
  ostringstream local_340 [383];
  undefined1 local_1c1;
  string local_1c0 [48];
  ostringstream local_190 [376];
  uint local_18;
  uint local_14;
  void *local_10;
  
  if (1 < in_R8D) {
    poVar3 = local_190;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"Currently do not support num > 1 in argmax");
    local_1c1 = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this,local_1c0);
    local_1c1 = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(int *)((long)in_RDX + 0x38) == 4) {
    poVar3 = local_340;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,
                    "Input Tensor to TensorTools::argmax must be associated with a memory pool.");
    local_361 = 1;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_360);
    local_361 = 0;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return_dim = in_RDI;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_RDX;
  memcpy(local_388,in_RDX,0x24);
  local_388[local_14] = local_18;
  IndexTensor::IndexTensor
            (in_RDI,in_stack_fffffffffffffba8,(DenseIndex *)in_stack_fffffffffffffba0,
             in_stack_fffffffffffffb98,(DeviceMempool)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  ppAVar1 = std::vector<dynet::AlignedMemoryPool_*,_std::allocator<dynet::AlignedMemoryPool_*>_>::
            operator[]((vector<dynet::AlignedMemoryPool_*,_std::allocator<dynet::AlignedMemoryPool_*>_>
                        *)(*(long *)((long)local_10 + 0x30) + 0x50),
                       (long)*(int *)((long)local_10 + 0x38));
  dev_00 = *ppAVar1;
  Dim::size(in_stack_fffffffffffffb90);
  pDVar2 = (DenseIndex *)
           AlignedMemoryPool::allocate(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  in_RDI->v = pDVar2;
  Tensor::tb<4>(local_418);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_0>::
  argmax(in_stack_fffffffffffffbc0,(Index)return_dim);
  IndexTensor::tb<3>((IndexTensor *)in_stack_fffffffffffffbd0);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_1>::
  device<Eigen::DefaultDevice>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)in_stack_fffffffffffffb90,(DefaultDevice *)dev_00);
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<long,4,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=(in_stack_fffffffffffffba0,
              (TensorTupleReducerOp<Eigen::internal::ArgMaxTupleReducer<Eigen::Tuple<long,_float>_>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>
               *)in_stack_fffffffffffffb98);
  return return_dim;
}

Assistant:

IndexTensor TensorTools::argmax_dev(const MyDevice & dev, const Tensor& v, unsigned dim, unsigned num) {
  if(num > 1)
    DYNET_RUNTIME_ERR("Currently do not support num > 1 in argmax");
  DYNET_ARG_CHECK(v.mem_pool != DeviceMempool::NONE, "Input Tensor to TensorTools::argmax must be associated with a memory pool.");
  Dim ids_dim = v.d; ids_dim.d[dim] = num;
  IndexTensor ids(ids_dim, nullptr, v.device, v.mem_pool);
  AlignedMemoryPool* pool = v.device->pools[(size_t)v.mem_pool];
  ids.v = static_cast<Eigen::DenseIndex*>(pool->allocate(ids_dim.size() * sizeof(Eigen::DenseIndex)));
  ids.tb<3>().device(*dev.edevice) = v.tb<4>().argmax(dim);
  return ids;
}